

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O3

void __thiscall level_mesh::collect_mu_models(level_mesh *this,size_t num_mu_instances)

{
  pointer *ppbVar1;
  pointer ppbVar2;
  iterator iVar3;
  uint16_t uVar4;
  long lVar5;
  b_model local_40;
  
  if (num_mu_instances != 0) {
    ppbVar2 = (this->m_instances).
              super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar5 = 0x3f;
    if (num_mu_instances != 0) {
      for (; num_mu_instances >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<b_model_instance**,std::vector<b_model_instance*,std::allocator<b_model_instance*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<model_id_pred>>
              (ppbVar2,ppbVar2 + num_mu_instances,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<b_model_instance**,std::vector<b_model_instance*,std::allocator<b_model_instance*>>>,__gnu_cxx::__ops::_Iter_comp_iter<model_id_pred>>
              (ppbVar2,ppbVar2 + num_mu_instances);
    if (num_mu_instances == 1) {
      local_40.m_num_instances = 1;
      local_40.field_3.m_instances = (b_model_instance **)0x0;
    }
    else {
      uVar4 = (*ppbVar2)->model_id;
      local_40.m_num_instances = 1;
      lVar5 = 8;
      local_40.field_3.m_instances = (b_model_instance **)0x0;
      do {
        if (*(uint16_t *)(*(long *)((long)ppbVar2 + lVar5) + 4) != uVar4) {
          local_40.m_type = MT_MU_MODEL;
          local_40.m_locked = false;
          iVar3._M_current =
               (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<b_model,_std::allocator<b_model>_>::_M_realloc_insert<b_model>
                      (&this->m_models,iVar3,&local_40);
          }
          else {
            (iVar3._M_current)->m_type = (int)4;
            (iVar3._M_current)->m_locked = (bool)(char)(4 >> 0x20);
            (iVar3._M_current)->field_0x5 = local_40._5_1_;
            (iVar3._M_current)->m_num_instances = local_40.m_num_instances;
            ((iVar3._M_current)->field_3).m_instances = (b_model_instance **)local_40.field_3;
            ppbVar1 = &(this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppbVar1 = *ppbVar1 + 1;
          }
          uVar4 = *(uint16_t *)(*(long *)((long)ppbVar2 + lVar5) + 4);
          local_40.field_3.m_instances = (b_model_instance **)(lVar5 >> 3);
          local_40.m_num_instances = 0;
        }
        local_40.m_num_instances = local_40.m_num_instances + 1;
        lVar5 = lVar5 + 8;
      } while (num_mu_instances << 3 != lVar5);
    }
    local_40.m_type = MT_MU_MODEL;
    local_40.m_locked = false;
    iVar3._M_current =
         (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<b_model,_std::allocator<b_model>_>::_M_realloc_insert<b_model>
                (&this->m_models,iVar3,&local_40);
    }
    else {
      (iVar3._M_current)->m_type = (int)4;
      (iVar3._M_current)->m_locked = (bool)(char)(4 >> 0x20);
      (iVar3._M_current)->field_0x5 = local_40._5_1_;
      (iVar3._M_current)->m_num_instances = local_40.m_num_instances;
      ((iVar3._M_current)->field_3).m_instances = (b_model_instance **)local_40.field_3;
      ppbVar1 = &(this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
  }
  return;
}

Assistant:

void level_mesh::collect_mu_models(size_t num_mu_instances)
{
	if (num_mu_instances) {
		b_model_instance_vec_it it0 = m_instances.begin(), it = it0, end = it + num_mu_instances;
		std::sort(it, end, model_id_pred());
		size_t num_instances = 1, instance0 = 0;
		for (uint16_t model_id = (*it++)->model_id; it != end; ++it, ++num_instances) {
			if ((*it)->model_id == model_id)
				continue;
			m_models.push_back(b_model(b_model::MT_MU_MODEL, num_instances, instance0));
			model_id = (*it)->model_id;
			instance0 = it - it0;
			num_instances = 0;
		}
		m_models.push_back(b_model(b_model::MT_MU_MODEL, num_instances, instance0));
	}
}